

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_ModelTest::ReadTest
          (ONX_ModelTest *this,char *file_path,Type test_type,bool bKeepModels,
          char *text_log_file_path,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_wString local_300;
  ON_wString wide_text_log_file_path;
  undefined1 local_2f0 [8];
  ON_BinaryFile archive;
  FILE *local_b0;
  FILE *fp;
  ON_TextLogNull devnull;
  ON_TextLog *text_log_local;
  char *text_log_file_path_local;
  bool bKeepModels_local;
  Type test_type_local;
  char *file_path_local;
  ONX_ModelTest *this_local;
  
  devnull.super_ON_TextLog._112_8_ = text_log;
  Internal_BeginTest(this);
  this->m_test_type = test_type;
  ON_TextLogNull::ON_TextLogNull((ON_TextLogNull *)&fp);
  if (devnull.super_ON_TextLog._112_8_ == 0) {
    devnull.super_ON_TextLog._112_8_ = &ON_TextLog::Null;
  }
  local_b0 = (FILE *)0x0;
  if ((file_path == (char *)0x0) || (*file_path == '\0')) {
    ONX_ErrorCounter::IncrementFailureCount(this->m_error_counts);
    ON_TextLog::Print((ON_TextLog *)devnull.super_ON_TextLog._112_8_,
                      "file_path was the empty string.");
  }
  else {
    local_b0 = ON_FileStream::Open3dmToRead(file_path);
    if (local_b0 == (FILE *)0x0) {
      ONX_ErrorCounter::IncrementFailureCount(this->m_error_counts);
      ON_TextLog::Print((ON_TextLog *)devnull.super_ON_TextLog._112_8_,
                        "ON_FileStream::Open(%s, \"rb\") failed.",file_path);
    }
    else {
      ON_BinaryFile::ON_BinaryFile((ON_BinaryFile *)local_2f0,read3dm,local_b0);
      ON_wString::ON_wString(&wide_text_log_file_path,file_path);
      pwVar3 = ON_wString::operator_cast_to_wchar_t_(&wide_text_log_file_path);
      ON_BinaryArchive::SetArchiveFullPath((ON_BinaryArchive *)local_2f0,pwVar3);
      ON_wString::~ON_wString(&wide_text_log_file_path);
      ON_wString::ON_wString(&local_300,text_log_file_path);
      pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_300);
      Internal_ReadTest(this,(ON_BinaryArchive *)local_2f0,test_type,bKeepModels,pwVar3,
                        (ON_TextLog *)devnull.super_ON_TextLog._112_8_);
      ON_wString::~ON_wString(&local_300);
      ON_BinaryFile::~ON_BinaryFile((ON_BinaryFile *)local_2f0);
    }
  }
  if ((local_b0 != (FILE *)0x0) && (iVar2 = ON_FileStream::Close(local_b0), iVar2 != 0)) {
    ON_TextLog::Print((ON_TextLog *)devnull.super_ON_TextLog._112_8_,
                      "ON_FileStream::Close(%s) failed.",file_path);
    ONX_ErrorCounter::IncrementErrorCount(this->m_error_counts);
  }
  bVar1 = Internal_TallyTestResults(this);
  ON_TextLogNull::~ON_TextLogNull((ON_TextLogNull *)&fp);
  return bVar1;
}

Assistant:

bool ONX_ModelTest::ReadTest(
    const char* file_path,
    ONX_ModelTest::Type test_type,
    bool bKeepModels,
    const char* text_log_file_path,
    ON_TextLog* text_log
)
{
  Internal_BeginTest();

  m_test_type = test_type;

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  FILE* fp = nullptr;
  for (;;)
  {
    if (nullptr == file_path || 0 == file_path[0])
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("file_path was the empty string.");
      break;
    }

    fp = ON_FileStream::Open3dmToRead(file_path);
    if (nullptr == fp)
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("ON_FileStream::Open(%s, \"rb\") failed.",file_path);
      break;
    }

    ON_BinaryFile archive(ON::archive_mode::read3dm, fp);
    archive.SetArchiveFullPath(ON_wString(file_path));

    ON_wString wide_text_log_file_path(text_log_file_path);
    Internal_ReadTest(archive, test_type, bKeepModels, wide_text_log_file_path, text_log);
    break;
  }

  if (nullptr != fp)
  {
    if (0 != ON_FileStream::Close(fp))
    {
      text_log->Print("ON_FileStream::Close(%s) failed.", file_path);
      m_error_counts[0].IncrementErrorCount();
    }
  }

  return Internal_TallyTestResults();
}